

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O1

void __thiscall xemmai::t_lexer::t_error::t_error(t_error *this,t_lexer *a_lexer)

{
  pointer pwVar1;
  size_t sVar2;
  
  (this->super_t_throwable)._vptr_t_throwable = (_func_int **)&PTR__t_throwable_0019b528;
  (this->super_t_throwable).v_backtrace._M_b._M_p = (__pointer_type)0x0;
  (this->super_t_throwable).v_message._M_dataplus._M_p =
       (pointer)&(this->super_t_throwable).v_message.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&(this->super_t_throwable).v_message,L"lexical error.",L"");
  (this->super_t_throwable)._vptr_t_throwable = (_func_int **)&PTR__t_error_0019b9e0;
  (this->v_path)._M_dataplus._M_p = (pointer)&(this->v_path).field_2;
  pwVar1 = (a_lexer->v_path)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->v_path,pwVar1,pwVar1 + (a_lexer->v_path)._M_string_length);
  (this->v_at).v_column = (a_lexer->v_at).v_column;
  sVar2 = (a_lexer->v_at).v_line;
  (this->v_at).v_position = (a_lexer->v_at).v_position;
  (this->v_at).v_line = sVar2;
  return;
}

Assistant:

t_error(t_lexer& a_lexer) : t_throwable(L"lexical error."sv), v_path(a_lexer.f_path()), v_at(a_lexer.f_at())
		{
		}